

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil.cpp
# Opt level: O0

QString * QDBusUtil::argumentToString(QVariant *arg)

{
  QString *in_RDI;
  QString *out;
  QString *in_stack_000000b0;
  QVariant *in_stack_000000b8;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2389e8);
  variantToString(in_stack_000000b8,in_stack_000000b0);
  return in_RDI;
}

Assistant:

QString argumentToString(const QVariant &arg)
    {
        QString out;

#ifndef QT_BOOTSTRAPPED
        variantToString(arg, out);
#else
        Q_UNUSED(arg);
#endif

        return out;
    }